

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O2

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  ushort uVar1;
  string_view fmt;
  format_args args;
  uint local_38 [6];
  back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>
  local_20;
  
  if ((uint)n < 100) {
    uVar1 = (ushort)n & 0xff;
    local_38[0] = CONCAT31(local_38[0]._1_3_,(char)(uVar1 / 10)) | 0x30;
    ::fmt::v11::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)local_38);
    local_38[0] = CONCAT31(local_38[0]._1_3_,(char)(uVar1 % 10)) | 0x30;
    ::fmt::v11::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)local_38);
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args.desc_ = 1;
    local_38[0] = n;
    local_20.container = dest;
    ::fmt::v11::
    vformat_to<std::back_insert_iterator<fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>_>_&,_0>
              (&local_20,fmt,args);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest) {
    if (n >= 0 && n < 100)  // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    } else  // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), SPDLOG_FMT_STRING("{:02}"), n);
    }
}